

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O1

void __thiscall
btQuantizedBvh::walkStacklessTree
          (btQuantizedBvh *this,btNodeOverlapCallback *nodeCallback,btVector3 *aabbMin,
          btVector3 *aabbMax)

{
  btScalar *pbVar1;
  float fVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  btOptimizedBvhNode *pbVar7;
  
  if (this->m_curNodeIndex < 1) {
    iVar5 = 0;
  }
  else {
    pbVar7 = (this->m_contiguousNodes).m_data;
    iVar6 = 0;
    iVar5 = 0;
    do {
      if (((pbVar7->m_aabbMaxOrg).m_floats[0] <= aabbMin->m_floats[0] &&
           aabbMin->m_floats[0] != (pbVar7->m_aabbMaxOrg).m_floats[0]) ||
         (fVar2 = (pbVar7->m_aabbMinOrg).m_floats[0],
         aabbMax->m_floats[0] <= fVar2 && fVar2 != aabbMax->m_floats[0])) {
        bVar4 = false;
      }
      else {
        bVar4 = true;
      }
      pbVar1 = (pbVar7->m_aabbMaxOrg).m_floats + 2;
      if ((*pbVar1 <= aabbMin->m_floats[2] && aabbMin->m_floats[2] != *pbVar1) ||
         (fVar2 = (pbVar7->m_aabbMinOrg).m_floats[2],
         aabbMax->m_floats[2] <= fVar2 && fVar2 != aabbMax->m_floats[2])) {
        bVar4 = false;
      }
      pbVar1 = (pbVar7->m_aabbMaxOrg).m_floats + 1;
      if ((*pbVar1 <= aabbMin->m_floats[1] && aabbMin->m_floats[1] != *pbVar1) ||
         (fVar2 = (pbVar7->m_aabbMinOrg).m_floats[1],
         aabbMax->m_floats[1] <= fVar2 && fVar2 != aabbMax->m_floats[1])) {
        bVar4 = false;
      }
      iVar3 = pbVar7->m_escapeIndex;
      if ((bVar4) && (iVar3 == -1)) {
        (*nodeCallback->_vptr_btNodeOverlapCallback[2])
                  (nodeCallback,(ulong)(uint)pbVar7->m_subPart,(ulong)(uint)pbVar7->m_triangleIndex)
        ;
      }
      if ((bool)(~bVar4 & iVar3 != -1)) {
        iVar6 = iVar6 + pbVar7->m_escapeIndex;
        pbVar7 = pbVar7 + pbVar7->m_escapeIndex;
      }
      else {
        pbVar7 = pbVar7 + 1;
        iVar6 = iVar6 + 1;
      }
      iVar5 = iVar5 + 1;
    } while (iVar6 < this->m_curNodeIndex);
  }
  if (maxIterations < iVar5) {
    maxIterations = iVar5;
  }
  return;
}

Assistant:

void	btQuantizedBvh::walkStacklessTree(btNodeOverlapCallback* nodeCallback,const btVector3& aabbMin,const btVector3& aabbMax) const
{
	btAssert(!m_useQuantization);

	const btOptimizedBvhNode* rootNode = &m_contiguousNodes[0];
	int escapeIndex, curIndex = 0;
	int walkIterations = 0;
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned aabbOverlap;

	while (curIndex < m_curNodeIndex)
	{
		//catch bugs in tree data
		btAssert (walkIterations < m_curNodeIndex);

		walkIterations++;
		aabbOverlap = TestAabbAgainstAabb2(aabbMin,aabbMax,rootNode->m_aabbMinOrg,rootNode->m_aabbMaxOrg);
		isLeafNode = rootNode->m_escapeIndex == -1;
		
		//PCK: unsigned instead of bool
		if (isLeafNode && (aabbOverlap != 0))
		{
			nodeCallback->processNode(rootNode->m_subPart,rootNode->m_triangleIndex);
		} 
		
		//PCK: unsigned instead of bool
		if ((aabbOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		} else
		{
			escapeIndex = rootNode->m_escapeIndex;
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;

}